

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextureBaseGL.cpp
# Opt level: O1

void __thiscall
Diligent::TextureBaseGL::CreateViewInternal
          (TextureBaseGL *this,TextureViewDesc *OrigViewDesc,ITextureView **ppView,
          bool bIsDefaultView)

{
  undefined8 uVar1;
  PFNGLTEXTUREVIEWPROC p_Var2;
  TEXTURE_FORMAT TVar3;
  bool bVar4;
  TEXTURE_FORMAT TVar5;
  GLenum GVar6;
  int iVar7;
  GLint GVar8;
  TextureViewGLImpl *this_00;
  GLTextureObj *pGVar9;
  uint uVar10;
  undefined4 uVar11;
  GLContextState *this_01;
  FixedBlockMemoryAllocator *pFVar12;
  bool bIsDefaultView_local;
  GLenum err_1;
  GLenum local_a4;
  string msg_2;
  string msg;
  TEXTURE_COMPONENT_SWIZZLE local_58;
  TEXTURE_COMPONENT_SWIZZLE TStack_57;
  RefCntAutoPtr<Diligent::DeviceContextGLImpl> pDeviceContext;
  RenderDeviceGLImpl *pDeviceGLImpl;
  TextureViewDesc *local_40;
  TextureDesc *local_38;
  
  bIsDefaultView_local = bIsDefaultView;
  if (ppView == (ITextureView **)0x0) {
    FormatString<char[22]>(&msg,(char (*) [22])"Null pointer provided");
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"CreateViewInternal",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
               ,0x18c);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p == &msg.field_2) {
      return;
    }
    operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    return;
  }
  if (*ppView != (ITextureView *)0x0) {
    FormatString<char[64]>
              (&msg,(char (*) [64])"Overwriting reference to existing object may cause memory leaks"
              );
    DebugAssertionFailed
              (msg._M_dataplus._M_p,"CreateViewInternal",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
               ,0x18e);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg._M_dataplus._M_p != &msg.field_2) {
      operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
    }
  }
  *ppView = (ITextureView *)0x0;
  uVar1 = *(undefined8 *)&(OrigViewDesc->Swizzle).B;
  msg._M_dataplus._M_p = (OrigViewDesc->super_DeviceObjectAttribs).Name;
  msg._M_string_length._0_1_ = OrigViewDesc->ViewType;
  msg._M_string_length._1_1_ = OrigViewDesc->TextureDim;
  msg._M_string_length._2_2_ = OrigViewDesc->Format;
  msg._M_string_length._4_4_ = OrigViewDesc->MostDetailedMip;
  msg.field_2._M_allocated_capacity._0_4_ = OrigViewDesc->NumMipLevels;
  msg.field_2._M_allocated_capacity._4_4_ = OrigViewDesc->field_5;
  msg.field_2._8_4_ = OrigViewDesc->field_6;
  msg.field_2._M_local_buf[0xc] = OrigViewDesc->AccessFlags;
  msg.field_2._13_1_ = OrigViewDesc->Flags;
  msg.field_2._M_local_buf[0xe] = (OrigViewDesc->Swizzle).R;
  msg.field_2._M_local_buf[0xf] = (OrigViewDesc->Swizzle).G;
  local_38 = &(this->super_TextureBase<Diligent::EngineGLImplTraits>).
              super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
              .m_Desc;
  local_40 = OrigViewDesc;
  ValidatedAndCorrectTextureViewDesc(local_38,(TextureViewDesc *)&msg);
  pDeviceGLImpl =
       DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>::
       GetDevice((DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                  *)this);
  pFVar12 = &(pDeviceGLImpl->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).
             m_TexViewObjAllocator;
  if (pFVar12 != (this->super_TextureBase<Diligent::EngineGLImplTraits>).m_dbgTexViewObjAllocator) {
    FormatString<char[87]>
              (&msg_2,(char (*) [87])
                      "Texture view allocator does not match allocator provided during texture initialization"
              );
    DebugAssertionFailed
              (msg_2._M_dataplus._M_p,"CreateViewInternal",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
               ,0x199);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg_2._M_dataplus._M_p != &msg_2.field_2) {
      operator_delete(msg_2._M_dataplus._M_p,msg_2.field_2._M_allocated_capacity + 1);
    }
  }
  GVar6 = TexFormatToGLInternalTexFormat
                    (msg._M_string_length._2_2_,
                     (this->super_TextureBase<Diligent::EngineGLImplTraits>).
                     super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                     .m_Desc.BindFlags);
  if (GVar6 == 0) {
    FormatString<char[27]>(&msg_2,(char (*) [27])"Unsupported texture format");
    DebugAssertionFailed
              (msg_2._M_dataplus._M_p,"CreateViewInternal",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
               ,0x19e);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg_2._M_dataplus._M_p != &msg_2.field_2) {
      operator_delete(msg_2._M_dataplus._M_p,msg_2.field_2._M_allocated_capacity + 1);
    }
  }
  if ((char)msg._M_string_length == '\x05') {
    if (msg.field_2._8_4_ != 1) {
      uVar10 = (this->super_TextureBase<Diligent::EngineGLImplTraits>).
               super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
               .m_Desc.field_3.ArraySize;
      if ((this->super_TextureBase<Diligent::EngineGLImplTraits>).
          super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
          .m_Desc.Type == RESOURCE_DIM_TEX_3D) {
        uVar10 = uVar10 >> (msg._M_string_length._4_1_ & 0x1f);
        if (msg.field_2._8_4_ == uVar10 + (uVar10 == 0)) goto LAB_00318771;
        uVar10 = (this->super_TextureBase<Diligent::EngineGLImplTraits>).
                 super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                 .m_Desc.field_3.ArraySize;
      }
      if (msg.field_2._8_4_ != uVar10) {
        FormatString<char[82]>
                  (&msg_2,(char (*) [82])
                          "Only single array/depth slice or the whole texture can be bound as UAV in OpenGL."
                  );
        DebugAssertionFailed
                  (msg_2._M_dataplus._M_p,"CreateViewInternal",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                   ,0x209);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg_2._M_dataplus._M_p != &msg_2.field_2) {
          operator_delete(msg_2._M_dataplus._M_p,msg_2.field_2._M_allocated_capacity + 1);
        }
      }
    }
LAB_00318771:
    if (msg.field_2._M_local_buf[0xc] == '\0') {
      FormatString<char[43]>(&msg_2,(char (*) [43])"At least one access flag must be specified");
      DebugAssertionFailed
                (msg_2._M_dataplus._M_p,"CreateViewInternal",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                 ,0x20b);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg_2._M_dataplus._M_p != &msg_2.field_2) {
        operator_delete(msg_2._M_dataplus._M_p,msg_2.field_2._M_allocated_capacity + 1);
      }
    }
    msg_2._M_string_length = (size_type)(TextureBaseGL *)0x0;
    if (bIsDefaultView_local != false) {
      msg_2._M_string_length = (size_type)this;
    }
    msg_2.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_b59a9d;
    msg_2.field_2._8_8_ = anon_var_dwarf_b599d3;
    err_1 = err_1 & 0xffffff00;
    msg_2._M_dataplus._M_p = (pointer)pFVar12;
    pDeviceContext.m_pObject = (DeviceContextGLImpl *)this;
    this_00 = MakeNewRCObj<Diligent::TextureViewGLImpl,Diligent::FixedBlockMemoryAllocator>::
              operator()((MakeNewRCObj<Diligent::TextureViewGLImpl,Diligent::FixedBlockMemoryAllocator>
                          *)&msg_2,&pDeviceGLImpl,(TextureViewDesc *)&msg,
                         (TextureBaseGL **)&pDeviceContext,(bool *)&err_1,&bIsDefaultView_local);
    goto LAB_0031881c;
  }
  if ((char)msg._M_string_length == '\x02') {
    if (msg.field_2._M_allocated_capacity._0_4_ != 1) {
      FormatString<char[44]>(&msg_2,(char (*) [44])"Only a single mip level can be bound as RTV");
      DebugAssertionFailed
                (msg_2._M_dataplus._M_p,"CreateViewInternal",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                 ,0x213);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg_2._M_dataplus._M_p != &msg_2.field_2) {
        operator_delete(msg_2._M_dataplus._M_p,msg_2.field_2._M_allocated_capacity + 1);
      }
    }
    msg_2._M_string_length = (size_type)(TextureBaseGL *)0x0;
    if (bIsDefaultView_local != false) {
      msg_2._M_string_length = (size_type)this;
    }
    msg_2.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_b59a9d;
    msg_2.field_2._8_8_ = anon_var_dwarf_b599d3;
    err_1 = err_1 & 0xffffff00;
    msg_2._M_dataplus._M_p = (pointer)pFVar12;
    pDeviceContext.m_pObject = (DeviceContextGLImpl *)this;
    this_00 = MakeNewRCObj<Diligent::TextureViewGLImpl,Diligent::FixedBlockMemoryAllocator>::
              operator()((MakeNewRCObj<Diligent::TextureViewGLImpl,Diligent::FixedBlockMemoryAllocator>
                          *)&msg_2,&pDeviceGLImpl,(TextureViewDesc *)&msg,
                         (TextureBaseGL **)&pDeviceContext,(bool *)&err_1,&bIsDefaultView_local);
    goto LAB_0031881c;
  }
  if ((char)msg._M_string_length != '\x01') {
    if ((byte)((char)msg._M_string_length - 3U) < 2) {
      if (msg.field_2._M_allocated_capacity._0_4_ != 1) {
        FormatString<char[44]>(&msg_2,(char (*) [44])"Only a single mip level can be bound as DSV");
        DebugAssertionFailed
                  (msg_2._M_dataplus._M_p,"CreateViewInternal",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                   ,0x21b);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)msg_2._M_dataplus._M_p != &msg_2.field_2) {
          operator_delete(msg_2._M_dataplus._M_p,msg_2.field_2._M_allocated_capacity + 1);
        }
      }
      msg_2._M_string_length = (size_type)(TextureBaseGL *)0x0;
      if (bIsDefaultView_local != false) {
        msg_2._M_string_length = (size_type)this;
      }
      msg_2.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_b59a9d;
      msg_2.field_2._8_8_ = anon_var_dwarf_b599d3;
      err_1 = err_1 & 0xffffff00;
      msg_2._M_dataplus._M_p = (pointer)pFVar12;
      pDeviceContext.m_pObject = (DeviceContextGLImpl *)this;
      this_00 = MakeNewRCObj<Diligent::TextureViewGLImpl,Diligent::FixedBlockMemoryAllocator>::
                operator()((MakeNewRCObj<Diligent::TextureViewGLImpl,Diligent::FixedBlockMemoryAllocator>
                            *)&msg_2,&pDeviceGLImpl,(TextureViewDesc *)&msg,
                           (TextureBaseGL **)&pDeviceContext,(bool *)&err_1,&bIsDefaultView_local);
    }
    else {
      this_00 = (TextureViewGLImpl *)0x0;
    }
    goto LAB_0031881c;
  }
  if (msg._M_string_length._1_1_ ==
      (this->super_TextureBase<Diligent::EngineGLImplTraits>).
      super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
      .m_Desc.Type) {
    TVar3 = msg._M_string_length._2_2_;
    TVar5 = GetDefaultTextureViewFormat
                      ((this->super_TextureBase<Diligent::EngineGLImplTraits>).
                       super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                       .m_Desc.Format,TEXTURE_VIEW_SHADER_RESOURCE,
                       (this->super_TextureBase<Diligent::EngineGLImplTraits>).
                       super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
                       .m_Desc.BindFlags);
    bVar4 = false;
    if ((TVar3 == TVar5) && (msg._M_string_length._4_4_ == 0)) {
      bVar4 = false;
      if ((msg.field_2._M_allocated_capacity._0_4_ ==
           (this->super_TextureBase<Diligent::EngineGLImplTraits>).
           super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
           .m_Desc.MipLevels) && (bVar4 = false, msg.field_2._M_allocated_capacity._4_4_ == 0)) {
        if (msg.field_2._8_4_ !=
            (this->super_TextureBase<Diligent::EngineGLImplTraits>).
            super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
            .m_Desc.field_3.ArraySize) goto LAB_00318675;
        bVar4 = IsIdentityComponentMapping((TextureComponentMapping *)((long)&msg.field_2 + 0xe));
      }
    }
  }
  else {
LAB_00318675:
    bVar4 = false;
  }
  msg_2._M_string_length = (size_type)(TextureBaseGL *)0x0;
  if (bIsDefaultView_local != false) {
    msg_2._M_string_length = (size_type)this;
  }
  msg_2.field_2._M_allocated_capacity = (size_type)anon_var_dwarf_b59a9d;
  msg_2.field_2._8_8_ = anon_var_dwarf_b599d3;
  err_1 = CONCAT31(err_1._1_3_,bVar4) ^ 1;
  msg_2._M_dataplus._M_p = (pointer)pFVar12;
  pDeviceContext.m_pObject = (DeviceContextGLImpl *)this;
  this_00 = MakeNewRCObj<Diligent::TextureViewGLImpl,Diligent::FixedBlockMemoryAllocator>::
            operator()((MakeNewRCObj<Diligent::TextureViewGLImpl,Diligent::FixedBlockMemoryAllocator>
                        *)&msg_2,&pDeviceGLImpl,(TextureViewDesc *)&msg,
                       (TextureBaseGL **)&pDeviceContext,(bool *)&err_1,&bIsDefaultView_local);
  if (bVar4 != false) goto LAB_0031881c;
  uVar11 = msg.field_2._8_4_;
  switch(msg._M_string_length._1_1_) {
  case RESOURCE_DIM_TEX_1D:
    msg.field_2._8_4_ = 1;
    uVar11 = 1;
    local_a4 = 0xde0;
    break;
  case RESOURCE_DIM_TEX_1D_ARRAY:
    local_a4 = 0x8c18;
    break;
  case RESOURCE_DIM_TEX_2D:
    local_a4 = 0xde1;
    if (1 < (this->super_TextureBase<Diligent::EngineGLImplTraits>).
            super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
            .m_Desc.SampleCount) {
      local_a4 = 0x9100;
    }
    msg.field_2._8_4_ = 1;
    goto LAB_00318943;
  case RESOURCE_DIM_TEX_2D_ARRAY:
    local_a4 = 0x8c1a;
    if (1 < (this->super_TextureBase<Diligent::EngineGLImplTraits>).
            super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
            .m_Desc.SampleCount) {
      local_a4 = 0x9102;
    }
    break;
  case RESOURCE_DIM_TEX_3D:
    uVar10 = (this->super_TextureBase<Diligent::EngineGLImplTraits>).
             super_DeviceObjectBase<Diligent::ITextureGL,_Diligent::RenderDeviceGLImpl,_Diligent::TextureDesc>
             .m_Desc.field_3.ArraySize >> (msg._M_string_length._4_1_ & 0x1f);
    iVar7 = uVar10 + (uVar10 == 0);
    local_a4 = 0x806f;
    if ((msg.field_2._M_allocated_capacity._4_4_ != 0) || (msg.field_2._8_4_ != iVar7)) {
      msg_2._M_dataplus._M_p = "";
      if (msg._M_dataplus._M_p != (pointer)0x0) {
        msg_2._M_dataplus = msg._M_dataplus;
      }
      LogError<false,char[18],char_const*,char[23],unsigned_int,char[15],unsigned_int,char[16],unsigned_int,char[21],unsigned_int,char[15],char_const*,char[98]>
                (false,"CreateViewInternal",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                 ,0x1d5,(char (*) [18])"3D texture view \'",(char **)&msg_2,
                 (char (*) [23])"\' (most detailed mip: ",(uint *)((long)&msg._M_string_length + 4),
                 (char (*) [15])"; mip levels: ",(uint *)&msg.field_2._M_allocated_capacity,
                 (char (*) [16])"; first slice: ",(uint *)(msg.field_2._M_local_buf + 4),
                 (char (*) [21])"; num depth slices: ",(uint *)(msg.field_2._M_local_buf + 8),
                 (char (*) [15])") of texture \'",(char **)local_38,
                 (char (*) [98])
                 "\' does not references all depth slices. 3D texture views in OpenGL must address all depth slices."
                );
      msg.field_2._8_4_ = iVar7;
      msg.field_2._M_allocated_capacity = msg.field_2._M_allocated_capacity & 0xffffffff;
    }
LAB_00318943:
    uVar11 = 1;
    break;
  case RESOURCE_DIM_TEX_CUBE:
    local_a4 = 0x8513;
    break;
  case RESOURCE_DIM_TEX_CUBE_ARRAY:
    local_a4 = 0x9009;
    break;
  default:
    FormatString<char[30]>(&msg_2,(char (*) [30])"Unsupported texture view type");
    DebugAssertionFailed
              (msg_2._M_dataplus._M_p,"CreateViewInternal",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
               ,0x1e5);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)msg_2._M_dataplus._M_p != &msg_2.field_2) {
      operator_delete(msg_2._M_dataplus._M_p,msg_2.field_2._M_allocated_capacity + 1);
    }
    local_a4 = 0;
  }
  if (__glewTextureView == (PFNGLTEXTUREVIEWPROC)0x0) {
    LogError<true,char[31]>
              (false,"CreateViewInternal",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
               ,0x1ea,(char (*) [31])"glTextureView is not supported");
  }
  p_Var2 = __glewTextureView;
  pGVar9 = TextureViewGLImpl::GetHandle(this_00);
  (*p_Var2)(pGVar9->m_uiHandle,local_a4,(this->m_GlTexture).m_uiHandle,GVar6,
            msg._M_string_length._4_4_,(GLuint)msg.field_2._M_allocated_capacity,
            (GLuint)((ulong)msg.field_2._0_8_ >> 0x20),uVar11);
  iVar7 = glGetError();
  msg_2._M_dataplus._M_p._0_4_ = iVar7;
  if (iVar7 != 0) {
    LogError<true,char[30],char[17],unsigned_int>
              (false,"CreateViewInternal",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
               ,0x1ed,(char (*) [30])"Failed to create texture view",
               (char (*) [17])"\nGL Error Code: ",(uint *)&msg_2);
  }
  this_00->m_ViewTexBindTarget = local_a4;
  bVar4 = IsIdentityComponentMapping((TextureComponentMapping *)((long)&msg.field_2 + 0xe));
  if (!bVar4) {
    if ((pDeviceGLImpl->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_wpImmediateContexts.
        super__Vector_base<Diligent::RefCntWeakPtr<Diligent::DeviceContextGLImpl>,_Diligent::STDAllocator<Diligent::RefCntWeakPtr<Diligent::DeviceContextGLImpl>,_Diligent::IMemoryAllocator>_>
        ._M_impl.super__Vector_impl_data._M_finish ==
        (pDeviceGLImpl->super_RenderDeviceBase<Diligent::EngineGLImplTraits>).m_wpImmediateContexts.
        super__Vector_base<Diligent::RefCntWeakPtr<Diligent::DeviceContextGLImpl>,_Diligent::STDAllocator<Diligent::RefCntWeakPtr<Diligent::DeviceContextGLImpl>,_Diligent::IMemoryAllocator>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      pDeviceContext.m_pObject = (DeviceContextGLImpl *)0x0;
    }
    else {
      RefCntWeakPtr<Diligent::DeviceContextGLImpl>::Lock
                ((RefCntWeakPtr<Diligent::DeviceContextGLImpl> *)&pDeviceContext);
    }
    GVar6 = local_a4;
    if (pDeviceContext.m_pObject == (DeviceContextGLImpl *)0x0) {
      FormatString<char[44]>(&msg_2,(char (*) [44])"Immediate device context has been destroyed");
      DebugAssertionFailed
                (msg_2._M_dataplus._M_p,"CreateViewInternal",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                 ,499);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg_2._M_dataplus._M_p != &msg_2.field_2) {
        operator_delete(msg_2._M_dataplus._M_p,msg_2.field_2._M_allocated_capacity + 1);
      }
    }
    this_01 = &(pDeviceContext.m_pObject)->m_ContextState;
    pGVar9 = TextureViewGLImpl::GetHandle(this_00);
    GLContextState::BindTexture(this_01,-1,GVar6,pGVar9);
    GVar8 = TextureComponentSwizzleToGLTextureSwizzle(msg.field_2._M_local_buf[0xe],0x1903);
    glTexParameteri(GVar6,0x8e42,GVar8);
    err_1 = glGetError();
    if (err_1 != 0) {
      LogError<false,char[53],char[17],unsigned_int>
                (false,"CreateViewInternal",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                 ,0x1f8,(char (*) [53])"Failed to set GL_TEXTURE_SWIZZLE_R texture parameter",
                 (char (*) [17])"\nGL Error Code: ",&err_1);
      FormatString<char[6]>(&msg_2,(char (*) [6])0x861532);
      DebugAssertionFailed
                (msg_2._M_dataplus._M_p,"CreateViewInternal",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                 ,0x1f8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg_2._M_dataplus._M_p != &msg_2.field_2) {
        operator_delete(msg_2._M_dataplus._M_p,msg_2.field_2._M_allocated_capacity + 1);
      }
    }
    GVar8 = TextureComponentSwizzleToGLTextureSwizzle(msg.field_2._M_local_buf[0xf],0x1904);
    glTexParameteri(GVar6,0x8e43,GVar8);
    err_1 = glGetError();
    if (err_1 != 0) {
      LogError<false,char[53],char[17],unsigned_int>
                (false,"CreateViewInternal",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                 ,0x1fa,(char (*) [53])"Failed to set GL_TEXTURE_SWIZZLE_G texture parameter",
                 (char (*) [17])"\nGL Error Code: ",&err_1);
      FormatString<char[6]>(&msg_2,(char (*) [6])0x861532);
      DebugAssertionFailed
                (msg_2._M_dataplus._M_p,"CreateViewInternal",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                 ,0x1fa);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg_2._M_dataplus._M_p != &msg_2.field_2) {
        operator_delete(msg_2._M_dataplus._M_p,msg_2.field_2._M_allocated_capacity + 1);
      }
    }
    local_58 = (TEXTURE_COMPONENT_SWIZZLE)uVar1;
    GVar8 = TextureComponentSwizzleToGLTextureSwizzle(local_58,0x1905);
    glTexParameteri(GVar6,0x8e44,GVar8);
    err_1 = glGetError();
    if (err_1 != 0) {
      LogError<false,char[53],char[17],unsigned_int>
                (false,"CreateViewInternal",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                 ,0x1fc,(char (*) [53])"Failed to set GL_TEXTURE_SWIZZLE_B texture parameter",
                 (char (*) [17])"\nGL Error Code: ",&err_1);
      FormatString<char[6]>(&msg_2,(char (*) [6])0x861532);
      DebugAssertionFailed
                (msg_2._M_dataplus._M_p,"CreateViewInternal",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                 ,0x1fc);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg_2._M_dataplus._M_p != &msg_2.field_2) {
        operator_delete(msg_2._M_dataplus._M_p,msg_2.field_2._M_allocated_capacity + 1);
      }
    }
    TStack_57 = (TEXTURE_COMPONENT_SWIZZLE)((ulong)uVar1 >> 8);
    GVar8 = TextureComponentSwizzleToGLTextureSwizzle(TStack_57,0x1906);
    glTexParameteri(GVar6,0x8e45,GVar8);
    err_1 = glGetError();
    if (err_1 != 0) {
      LogError<false,char[53],char[17],unsigned_int>
                (false,"CreateViewInternal",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                 ,0x1fe,(char (*) [53])"Failed to set GL_TEXTURE_SWIZZLE_A texture parameter",
                 (char (*) [17])"\nGL Error Code: ",&err_1);
      FormatString<char[6]>(&msg_2,(char (*) [6])0x861532);
      DebugAssertionFailed
                (msg_2._M_dataplus._M_p,"CreateViewInternal",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/TextureBaseGL.cpp"
                 ,0x1fe);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)msg_2._M_dataplus._M_p != &msg_2.field_2) {
        operator_delete(msg_2._M_dataplus._M_p,msg_2.field_2._M_allocated_capacity + 1);
      }
    }
    msg_2._M_dataplus._M_p = (pointer)0x0;
    msg_2._M_string_length = msg_2._M_string_length & 0xffffffff00000000;
    GLContextState::BindTexture(this_01,-1,GVar6,(GLTextureObj *)&msg_2);
    if ((GLenum)msg_2._M_dataplus._M_p != 0) {
      err_1 = (GLenum)msg_2._M_dataplus._M_p;
      if (msg_2._M_dataplus._M_p._4_4_ == 0) {
        glDeleteTextures(1,&err_1);
      }
      else {
        msg_2._M_dataplus._M_p = (pointer)0x0;
      }
      msg_2._M_dataplus._M_p = msg_2._M_dataplus._M_p & 0xffffffff00000000;
    }
    RefCntAutoPtr<Diligent::DeviceContextGLImpl>::Release(&pDeviceContext);
  }
LAB_0031881c:
  if (bIsDefaultView_local == true) {
    *ppView = (ITextureView *)this_00;
  }
  else if (this_00 != (TextureViewGLImpl *)0x0) {
    TextureViewGLImpl::QueryInterface(this_00,(INTERFACE_ID *)IID_TextureView,(IObject **)ppView);
  }
  return;
}

Assistant:

void TextureBaseGL::CreateViewInternal(const TextureViewDesc& OrigViewDesc, ITextureView** ppView, bool bIsDefaultView)
{
    VERIFY(ppView != nullptr, "Null pointer provided");
    if (!ppView) return;
    VERIFY(*ppView == nullptr, "Overwriting reference to existing object may cause memory leaks");

    *ppView = nullptr;

    try
    {
        TextureViewDesc ViewDesc = OrigViewDesc;
        ValidatedAndCorrectTextureViewDesc(m_Desc, ViewDesc);

        RenderDeviceGLImpl*        pDeviceGLImpl    = GetDevice();
        FixedBlockMemoryAllocator& TexViewAllocator = pDeviceGLImpl->GetTexViewObjAllocator();
        VERIFY(&TexViewAllocator == &m_dbgTexViewObjAllocator, "Texture view allocator does not match allocator provided during texture initialization");

        // http://www.opengl.org/wiki/Texture_Storage#Texture_views

        GLenum GLViewFormat = TexFormatToGLInternalTexFormat(ViewDesc.Format, m_Desc.BindFlags);
        VERIFY(GLViewFormat != 0, "Unsupported texture format");

        TextureViewGLImpl* pViewOGL = nullptr;
        if (ViewDesc.ViewType == TEXTURE_VIEW_SHADER_RESOURCE)
        {
            // clang-format off
            bool bIsFullTextureView =
                ViewDesc.TextureDim               == m_Desc.Type &&
                ViewDesc.Format                   == GetDefaultTextureViewFormat(m_Desc.Format, ViewDesc.ViewType, m_Desc.BindFlags) &&
                ViewDesc.MostDetailedMip          == 0 &&
                ViewDesc.NumMipLevels             == m_Desc.MipLevels &&
                ViewDesc.FirstArrayOrDepthSlice() == 0 &&
                ViewDesc.NumArrayOrDepthSlices()  == m_Desc.ArraySizeOrDepth() &&
                IsIdentityComponentMapping(ViewDesc.Swizzle);
            // clang-format on

            pViewOGL = NEW_RC_OBJ(TexViewAllocator, "TextureViewGLImpl instance", TextureViewGLImpl, bIsDefaultView ? this : nullptr)(
                pDeviceGLImpl, ViewDesc, this,
                !bIsFullTextureView, // Create OpenGL texture view object if view
                                     // does not address the whole texture
                bIsDefaultView);
            if (!bIsFullTextureView)
            {
                GLenum GLViewTarget = 0;
                GLuint NumLayers    = ViewDesc.NumArraySlices;
                switch (ViewDesc.TextureDim)
                {
                    case RESOURCE_DIM_TEX_1D:
                        GLViewTarget            = GL_TEXTURE_1D;
                        ViewDesc.NumArraySlices = NumLayers = 1;
                        break;

                    case RESOURCE_DIM_TEX_1D_ARRAY:
                        GLViewTarget = GL_TEXTURE_1D_ARRAY;
                        break;

                    case RESOURCE_DIM_TEX_2D:
                        GLViewTarget            = m_Desc.SampleCount > 1 ? GL_TEXTURE_2D_MULTISAMPLE : GL_TEXTURE_2D;
                        ViewDesc.NumArraySlices = NumLayers = 1;
                        break;

                    case RESOURCE_DIM_TEX_2D_ARRAY:
                        GLViewTarget = m_Desc.SampleCount > 1 ? GL_TEXTURE_2D_MULTISAMPLE_ARRAY : GL_TEXTURE_2D_ARRAY;
                        break;

                    case RESOURCE_DIM_TEX_3D:
                    {
                        GLViewTarget = GL_TEXTURE_3D;
                        // If target is GL_TEXTURE_3D, NumLayers must equal 1.
                        Uint32 MipDepth = std::max(m_Desc.Depth >> ViewDesc.MostDetailedMip, 1U);
                        if (ViewDesc.FirstDepthSlice != 0 || ViewDesc.NumDepthSlices != MipDepth)
                        {
                            LOG_ERROR("3D texture view '", (ViewDesc.Name ? ViewDesc.Name : ""), "' (most detailed mip: ", ViewDesc.MostDetailedMip,
                                      "; mip levels: ", ViewDesc.NumMipLevels, "; first slice: ", ViewDesc.FirstDepthSlice,
                                      "; num depth slices: ", ViewDesc.NumDepthSlices, ") of texture '", m_Desc.Name, "' does not references"
                                                                                                                      " all depth slices. 3D texture views in OpenGL must address all depth slices.");
                            ViewDesc.NumDepthSlices  = MipDepth;
                            ViewDesc.FirstDepthSlice = 0;
                        }
                        NumLayers = 1;
                        break;
                    }

                    case RESOURCE_DIM_TEX_CUBE:
                        GLViewTarget = GL_TEXTURE_CUBE_MAP;
                        break;

                    case RESOURCE_DIM_TEX_CUBE_ARRAY:
                        GLViewTarget = GL_TEXTURE_CUBE_MAP_ARRAY;
                        break;

                    default: UNEXPECTED("Unsupported texture view type");
                }

                // In OpenGL ES this function is allowed as an extension and may not be supported
                if (glTextureView == nullptr)
                    LOG_ERROR_AND_THROW("glTextureView is not supported");

                glTextureView(pViewOGL->GetHandle(), GLViewTarget, m_GlTexture, GLViewFormat, ViewDesc.MostDetailedMip, ViewDesc.NumMipLevels, ViewDesc.FirstArraySlice, NumLayers);
                DEV_CHECK_GL_ERROR_AND_THROW("Failed to create texture view");
                pViewOGL->SetBindTarget(GLViewTarget);

                if (!IsIdentityComponentMapping(ViewDesc.Swizzle))
                {
                    RefCntAutoPtr<DeviceContextGLImpl> pDeviceContext = pDeviceGLImpl->GetImmediateContext(0);
                    VERIFY(pDeviceContext, "Immediate device context has been destroyed");
                    GLContextState& GLState = pDeviceContext->GetContextState();

                    GLState.BindTexture(-1, GLViewTarget, pViewOGL->GetHandle());
                    glTexParameteri(GLViewTarget, GL_TEXTURE_SWIZZLE_R, TextureComponentSwizzleToGLTextureSwizzle(ViewDesc.Swizzle.R, GL_RED));
                    DEV_CHECK_GL_ERROR("Failed to set GL_TEXTURE_SWIZZLE_R texture parameter");
                    glTexParameteri(GLViewTarget, GL_TEXTURE_SWIZZLE_G, TextureComponentSwizzleToGLTextureSwizzle(ViewDesc.Swizzle.G, GL_GREEN));
                    DEV_CHECK_GL_ERROR("Failed to set GL_TEXTURE_SWIZZLE_G texture parameter");
                    glTexParameteri(GLViewTarget, GL_TEXTURE_SWIZZLE_B, TextureComponentSwizzleToGLTextureSwizzle(ViewDesc.Swizzle.B, GL_BLUE));
                    DEV_CHECK_GL_ERROR("Failed to set GL_TEXTURE_SWIZZLE_B texture parameter");
                    glTexParameteri(GLViewTarget, GL_TEXTURE_SWIZZLE_A, TextureComponentSwizzleToGLTextureSwizzle(ViewDesc.Swizzle.A, GL_ALPHA));
                    DEV_CHECK_GL_ERROR("Failed to set GL_TEXTURE_SWIZZLE_A texture parameter");
                    GLState.BindTexture(-1, GLViewTarget, GLObjectWrappers::GLTextureObj::Null());
                }
            }
        }
        else if (ViewDesc.ViewType == TEXTURE_VIEW_UNORDERED_ACCESS)
        {
            // clang-format off
            VERIFY(ViewDesc.NumArrayOrDepthSlices() == 1 ||
                   (m_Desc.Type == RESOURCE_DIM_TEX_3D && ViewDesc.NumDepthSlices == std::max(m_Desc.Depth >> ViewDesc.MostDetailedMip, 1U)) ||
                   ViewDesc.NumArraySlices == m_Desc.ArraySize,
                   "Only single array/depth slice or the whole texture can be bound as UAV in OpenGL.");
            // clang-format on
            VERIFY(ViewDesc.AccessFlags != 0, "At least one access flag must be specified");
            pViewOGL = NEW_RC_OBJ(TexViewAllocator, "TextureViewGLImpl instance", TextureViewGLImpl, bIsDefaultView ? this : nullptr)(
                pDeviceGLImpl, ViewDesc, this,
                false, // Do NOT create texture view OpenGL object
                bIsDefaultView);
        }
        else if (ViewDesc.ViewType == TEXTURE_VIEW_RENDER_TARGET)
        {
            VERIFY(ViewDesc.NumMipLevels == 1, "Only a single mip level can be bound as RTV");
            pViewOGL = NEW_RC_OBJ(TexViewAllocator, "TextureViewGLImpl instance", TextureViewGLImpl, bIsDefaultView ? this : nullptr)(
                pDeviceGLImpl, ViewDesc, this,
                false, // Do NOT create texture view OpenGL object
                bIsDefaultView);
        }
        else if (ViewDesc.ViewType == TEXTURE_VIEW_DEPTH_STENCIL || ViewDesc.ViewType == TEXTURE_VIEW_READ_ONLY_DEPTH_STENCIL)
        {
            VERIFY(ViewDesc.NumMipLevels == 1, "Only a single mip level can be bound as DSV");
            pViewOGL = NEW_RC_OBJ(TexViewAllocator, "TextureViewGLImpl instance", TextureViewGLImpl, bIsDefaultView ? this : nullptr)(
                pDeviceGLImpl, ViewDesc, this,
                false, // Do NOT create texture view OpenGL object
                bIsDefaultView);
        }

        if (bIsDefaultView)
            *ppView = pViewOGL;
        else
        {
            if (pViewOGL)
            {
                pViewOGL->QueryInterface(IID_TextureView, reinterpret_cast<IObject**>(ppView));
            }
        }
    }
    catch (const std::runtime_error&)
    {
        const char* ViewTypeName = GetTexViewTypeLiteralName(OrigViewDesc.ViewType);
        LOG_ERROR("Failed to create view '", (OrigViewDesc.Name ? OrigViewDesc.Name : ""), "' (", ViewTypeName, ") for texture '", (m_Desc.Name ? m_Desc.Name : ""), "'");
    }
}